

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

State __thiscall QAccessibleToolButton::state(QAccessibleToolButton *this)

{
  long lVar1;
  bool bVar2;
  State SVar3;
  QMenu *pQVar4;
  QToolButton *in_RDI;
  long in_FS_OFFSET;
  QAccessibleButton *unaff_retaddr;
  State st;
  QToolButton *in_stack_ffffffffffffffd8;
  State local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar3 = QAccessibleButton::state(unaff_retaddr);
  local_10._0_5_ = SVar3._0_5_;
  local_10._5_3_ = 0xaaaaaa;
  toolButton((QAccessibleToolButton *)0x7ee911);
  bVar2 = QToolButton::autoRaise(in_RDI);
  if (bVar2) {
    local_10 = (State)(CONCAT44(local_10._4_4_,SVar3._0_4_) & 0xfffffffffffffdff | 0x200);
  }
  toolButton((QAccessibleToolButton *)0x7ee93b);
  pQVar4 = QToolButton::menu(in_stack_ffffffffffffffd8);
  if (pQVar4 != (QMenu *)0x0) {
    local_10 = (State)((ulong)local_10 & 0xffffffffefffffff | 0x10000000);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QAccessible::State QAccessibleToolButton::state() const
{
    QAccessible::State st = QAccessibleButton::state();
    if (toolButton()->autoRaise())
        st.hotTracked = true;
#if QT_CONFIG(menu)
    if (toolButton()->menu())
        st.hasPopup = true;
#endif
    return st;
}